

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QSpanCollection::updateRemovedRows(QSpanCollection *this,int start,int end)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  reference ppSVar6;
  int *piVar7;
  Span **ppSVar8;
  QMap<int,_QSpanCollection::Span_*> *pQVar9;
  int in_EDX;
  int in_ESI;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_RDI;
  long in_FS_OFFSET;
  SubIndex *start_subindex;
  bool span_at_start;
  SubIndex *subindex;
  int y;
  int delta;
  Span *span_2;
  iterator it_3;
  iterator it_top;
  iterator it_2;
  iterator it_start;
  Span *span_1;
  iterator it_1;
  SubIndex spansToBeMoved;
  iterator it_y;
  Span *span;
  iterator it;
  SpanList spansToBeDeleted;
  iterator *in_stack_fffffffffffffe18;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_fffffffffffffe20
  ;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_fffffffffffffe28
  ;
  const_iterator in_stack_fffffffffffffe30;
  QMap<int,_QSpanCollection::Span_*> *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  const_iterator in_stack_fffffffffffffe48;
  QSpanCollection *in_stack_fffffffffffffe50;
  undefined1 local_108 [12];
  int local_fc;
  iterator local_f8;
  iterator local_f0;
  int local_e4;
  iterator local_e0;
  iterator local_d8;
  iterator local_d0;
  undefined1 local_c8 [12];
  int local_bc;
  iterator local_b8;
  iterator local_b0;
  int local_a4;
  iterator local_a0;
  iterator local_98;
  iterator local_88;
  Span *local_80;
  iterator local_78;
  iterator local_70;
  undefined1 *local_68;
  iterator local_58;
  iterator local_50;
  _List_const_iterator<QSpanCollection::Span_*> local_48;
  _List_node_base *local_40;
  Span *local_38;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
          empty(in_RDI);
  if (!bVar3) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::list
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)0x8b1299);
    iVar5 = (in_EDX - in_ESI) + 1;
    local_28._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
         begin(in_stack_fffffffffffffe20);
    while( true ) {
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
           end(in_stack_fffffffffffffe20);
      bVar3 = std::operator!=(&local_28,&local_30);
      if (!bVar3) break;
      ppSVar6 = std::_List_iterator<QSpanCollection::Span_*>::operator*
                          ((_List_iterator<QSpanCollection::Span_*> *)0x8b130f);
      local_38 = *ppSVar6;
      if (local_38->m_bottom < in_ESI) {
        std::_List_iterator<QSpanCollection::Span_*>::operator++(&local_28);
      }
      else {
        if (local_38->m_top < in_ESI) {
          if (in_EDX < local_38->m_bottom) {
            local_38->m_bottom = local_38->m_bottom - iVar5;
          }
          else {
            local_38->m_bottom = in_ESI + -1;
          }
        }
        else if (in_EDX < local_38->m_bottom) {
          if (in_EDX < local_38->m_top) {
            local_38->m_top = local_38->m_top - iVar5;
          }
          else {
            local_38->m_top = in_ESI;
          }
          local_38->m_bottom = local_38->m_bottom - iVar5;
        }
        else {
          local_38->will_be_deleted = true;
        }
        if ((local_38->m_top == local_38->m_bottom) && (local_38->m_left == local_38->m_right)) {
          local_38->will_be_deleted = true;
        }
        if ((local_38->will_be_deleted & 1U) == 0) {
          std::_List_iterator<QSpanCollection::Span_*>::operator++(&local_28);
        }
        else {
          std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
          push_back((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                    in_stack_fffffffffffffe30._M_node,(value_type *)in_stack_fffffffffffffe28);
          std::_List_const_iterator<QSpanCollection::Span_*>::_List_const_iterator
                    (&local_48,&local_28);
          local_40 = (_List_node_base *)
                     std::__cxx11::
                     list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::erase
                               (in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
          local_28._M_node = local_40;
        }
      }
    }
    bVar3 = std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
            empty(in_RDI);
    if (bVar3) {
      qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
                (in_stack_fffffffffffffe20);
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear
                ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_stack_fffffffffffffe20);
    }
    else {
      local_50._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_50._M_node =
           (_Base_ptr)
           QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end
                     ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                      in_stack_fffffffffffffe30._M_node);
      do {
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator--
                  ((iterator *)in_stack_fffffffffffffe20);
        piVar7 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::key((iterator *)0x8b1535)
        ;
        iVar1 = *piVar7;
        iVar2 = -iVar1;
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::value((iterator *)0x8b1562);
        if (iVar2 < in_ESI) {
          bVar3 = cleanSpanSubIndex(in_stack_fffffffffffffe50,
                                    (SubIndex *)in_stack_fffffffffffffe48._M_node,
                                    (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                                    SUB81((ulong)in_stack_fffffffffffffe40 >> 0x18,0));
          if (bVar3) {
            QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::const_iterator
                      ((const_iterator *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            local_58._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                            in_stack_fffffffffffffe28,in_stack_fffffffffffffe48._M_node);
            local_50._M_node = local_58._M_node;
          }
        }
        else if ((iVar2 < in_ESI) || (in_EDX < iVar2)) {
          if (iVar2 == in_EDX + 1) {
            local_e0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
            local_e4 = iVar1 + iVar5;
            local_e0._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find
                           ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                            in_stack_fffffffffffffe38,(int *)in_stack_fffffffffffffe30._M_node);
            local_f0._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end
                           ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                            in_stack_fffffffffffffe30._M_node);
            bVar3 = ::operator==((iterator *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            if (bVar3) {
              in_stack_fffffffffffffe30._M_node = (_List_node_base *)(in_RDI + 1);
              local_fc = iVar1 + iVar5;
              memset(local_108,0,8);
              QMap<int,_QSpanCollection::Span_*>::QMap
                        ((QMap<int,_QSpanCollection::Span_*> *)0x8b1a6d);
              local_f8._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                             ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                              in_stack_fffffffffffffe30._M_node,(int *)in_stack_fffffffffffffe28,
                              (QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe20);
              local_e0._M_node = local_f8._M_node;
              QMap<int,_QSpanCollection::Span_*>::~QMap
                        ((QMap<int,_QSpanCollection::Span_*> *)0x8b1aac);
            }
            QMap<int,_QSpanCollection::Span_*>::begin
                      ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node);
            while( true ) {
              QMap<int,_QSpanCollection::Span_*>::end
                        ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node);
              bVar3 = ::operator!=((iterator *)in_stack_fffffffffffffe20,
                                   (iterator *)in_stack_fffffffffffffe18);
              if (!bVar3) break;
              ppSVar8 = QMap<int,_QSpanCollection::Span_*>::iterator::value((iterator *)0x8b1b0d);
              if (((*ppSVar8)->will_be_deleted & 1U) == 0) {
                in_stack_fffffffffffffe28 =
                     (list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::value
                               ((iterator *)0x8b1b33);
                QMap<int,_QSpanCollection::Span_*>::iterator::key((iterator *)0x8b1b45);
                QMap<int,_QSpanCollection::Span_*>::insert
                          ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node,
                           (int *)in_stack_fffffffffffffe28,(Span **)in_stack_fffffffffffffe20);
              }
              QMap<int,_QSpanCollection::Span_*>::iterator::operator++
                        ((iterator *)in_stack_fffffffffffffe20);
            }
          }
          else {
            QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                      ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                       in_stack_fffffffffffffe30._M_node,(int *)in_stack_fffffffffffffe28,
                       (QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe20);
          }
          in_stack_fffffffffffffe20 = in_RDI + 1;
          QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::const_iterator
                    ((const_iterator *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          local_50._M_node =
               (_Base_ptr)
               QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                         ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                          in_stack_fffffffffffffe28,in_stack_fffffffffffffe48._M_node);
        }
        else {
          bVar3 = false;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          QMap<int,_QSpanCollection::Span_*>::QMap((QMap<int,_QSpanCollection::Span_*> *)0x8b1636);
          local_70._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          local_70._M_node =
               (_Base_ptr)
               QMap<int,_QSpanCollection::Span_*>::begin
                         ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node);
          while( true ) {
            local_78._M_node =
                 (_Base_ptr)
                 QMap<int,_QSpanCollection::Span_*>::end
                           ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node)
            ;
            bVar4 = ::operator!=((iterator *)in_stack_fffffffffffffe20,
                                 (iterator *)in_stack_fffffffffffffe18);
            if (!bVar4) break;
            ppSVar8 = QMap<int,_QSpanCollection::Span_*>::iterator::value((iterator *)0x8b169a);
            local_80 = *ppSVar8;
            if ((local_80->will_be_deleted & 1U) == 0) {
              if ((!bVar3) && (local_80->m_top == in_ESI)) {
                bVar3 = true;
              }
              QMap<int,_QSpanCollection::Span_*>::iterator::key((iterator *)0x8b16e1);
              QMap<int,_QSpanCollection::Span_*>::insert
                        ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node,
                         (int *)in_stack_fffffffffffffe28,(Span **)in_stack_fffffffffffffe20);
            }
            QMap<int,_QSpanCollection::Span_*>::iterator::operator++
                      ((iterator *)in_stack_fffffffffffffe20);
          }
          if ((iVar2 == in_ESI) && (bVar3)) {
            QMap<int,_QSpanCollection::Span_*>::clear
                      ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe20);
          }
          else {
            in_stack_fffffffffffffe50 = (QSpanCollection *)(in_RDI + 1);
            QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::const_iterator
                      ((const_iterator *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            local_88._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                            in_stack_fffffffffffffe28,in_stack_fffffffffffffe48._M_node);
            local_50._M_node = local_88._M_node;
          }
          if (bVar3) {
            local_98._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
            QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::iterator((iterator *)0x8b17aa)
            ;
            if (iVar2 == in_ESI) {
              local_98._M_node = local_50._M_node;
            }
            else {
              local_a4 = -in_ESI;
              local_a0._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find
                             ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                              in_stack_fffffffffffffe38,(int *)in_stack_fffffffffffffe30._M_node);
              local_98._M_node = local_a0._M_node;
              local_b0._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end
                             ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                              in_stack_fffffffffffffe30._M_node);
              bVar3 = ::operator==((iterator *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              if (bVar3) {
                in_stack_fffffffffffffe48._M_node = (_Base_ptr)(in_RDI + 1);
                local_bc = -in_ESI;
                memset(local_c8,0,8);
                QMap<int,_QSpanCollection::Span_*>::QMap
                          ((QMap<int,_QSpanCollection::Span_*> *)0x8b187d);
                local_b8._M_node =
                     (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                               ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                                in_stack_fffffffffffffe30._M_node,(int *)in_stack_fffffffffffffe28,
                                (QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe20);
                local_98._M_node = local_b8._M_node;
                QMap<int,_QSpanCollection::Span_*>::~QMap
                          ((QMap<int,_QSpanCollection::Span_*> *)0x8b18bc);
              }
            }
            pQVar9 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::value
                               ((iterator *)0x8b18da);
            local_d0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
            local_d0._M_node =
                 (_Base_ptr)
                 QMap<int,_QSpanCollection::Span_*>::begin
                           ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node)
            ;
            while( true ) {
              local_d8._M_node =
                   (_Base_ptr)
                   QMap<int,_QSpanCollection::Span_*>::end
                             ((QMap<int,_QSpanCollection::Span_*> *)
                              in_stack_fffffffffffffe30._M_node);
              bVar3 = ::operator!=((iterator *)in_stack_fffffffffffffe20,
                                   (iterator *)in_stack_fffffffffffffe18);
              if (!bVar3) break;
              in_stack_fffffffffffffe38 = pQVar9;
              in_stack_fffffffffffffe40 =
                   QMap<int,_QSpanCollection::Span_*>::iterator::key((iterator *)0x8b194a);
              QMap<int,_QSpanCollection::Span_*>::iterator::value((iterator *)0x8b195c);
              QMap<int,_QSpanCollection::Span_*>::insert
                        ((QMap<int,_QSpanCollection::Span_*> *)in_stack_fffffffffffffe30._M_node,
                         (int *)in_stack_fffffffffffffe28,(Span **)in_stack_fffffffffffffe20);
              QMap<int,_QSpanCollection::Span_*>::iterator::operator++
                        ((iterator *)in_stack_fffffffffffffe20);
            }
          }
          QMap<int,_QSpanCollection::Span_*>::~QMap((QMap<int,_QSpanCollection::Span_*> *)0x8b1991);
        }
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin
                  ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                   in_stack_fffffffffffffe30._M_node);
        bVar3 = ::operator!=((iterator *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      } while (bVar3);
      qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
                (in_stack_fffffffffffffe20);
    }
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::~list
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)0x8b1c56);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSpanCollection::updateRemovedRows(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    SpanList spansToBeDeleted;
    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (SpanList::iterator it = spans.begin(); it != spans.end(); ) {
        Span *span = *it;
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_bottom < start) {
            ++it;
            continue;
        }
        if (span->m_top < start) {
            if (span->m_bottom <= end)
                span->m_bottom = start - 1;
            else
                span->m_bottom -= delta;
        } else {
            if (span->m_bottom > end) {
                if (span->m_top <= end)
                    span->m_top = start;
                else
                    span->m_top -= delta;
                span->m_bottom -= delta;
            } else {
                span->will_be_deleted = true;
            }
        }
        if (span->m_top == span->m_bottom && span->m_left == span->m_right)
            span->will_be_deleted = true;
        if (span->will_be_deleted) {
            spansToBeDeleted.push_back(span);
            it = spans.erase(it);
        } else {
            ++it;
        }
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif
    if (spans.empty()) {
        qDeleteAll(spansToBeDeleted);
        index.clear();
        return;
    }

    Index::iterator it_y = index.end();
    do {
        --it_y;
        int y = -it_y.key();
        SubIndex &subindex = it_y.value();
        if (y < start) {
            if (cleanSpanSubIndex(subindex, y))
                it_y = index.erase(it_y);
        } else if (y >= start && y <= end) {
            bool span_at_start = false;
            SubIndex spansToBeMoved;
            for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ++it) {
                Span *span = it.value();
                if (span->will_be_deleted)
                    continue;
                if (!span_at_start && span->m_top == start)
                    span_at_start = true;
                spansToBeMoved.insert(it.key(), span);
            }

            if (y == start && span_at_start)
                subindex.clear();
            else
                it_y = index.erase(it_y);

            if (span_at_start) {
                Index::iterator it_start;
                if (y == start)
                    it_start = it_y;
                else {
                    it_start = index.find(-start);
                    if (it_start == index.end())
                        it_start = index.insert(-start, SubIndex());
                }
                SubIndex &start_subindex = it_start.value();
                for (SubIndex::iterator it = spansToBeMoved.begin(); it != spansToBeMoved.end(); ++it)
                    start_subindex.insert(it.key(), it.value());
            }
        } else {
            if (y == end + 1) {
                Index::iterator it_top = index.find(-y + delta);
                if (it_top == index.end())
                    it_top = index.insert(-y + delta, SubIndex());
                for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ) {
                    Span *span = it.value();
                    if (!span->will_be_deleted)
                        it_top.value().insert(it.key(), span);
                    ++it;
                }
            } else {
                index.insert(-y + delta, subindex);
            }
            it_y = index.erase(it_y);
        }
    } while (it_y != index.begin());

#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
    qDebug("Deleted");
    qDebug() << spansToBeDeleted;
#endif
    qDeleteAll(spansToBeDeleted);
}